

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

Data2D<int> * __thiscall
TasGrid::GridLocalPolynomial::buildUpdateMap<(TasGrid::RuleLocal::erule)2>
          (Data2D<int> *__return_storage_ptr__,GridLocalPolynomial *this,double tolerance,
          TypeRefinement criteria,int output,double *scale_correction)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  pointer pdVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  _Bit_type *p_Var9;
  int iVar10;
  int *piVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  size_t sVar15;
  bool bVar16;
  uint uVar17;
  int iVar18;
  size_type sVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  pointer pdVar23;
  long lVar24;
  _Bit_type *__first_p;
  MultiIndexSet *mset;
  ulong *puVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  pointer piVar29;
  long lVar30;
  long lVar31;
  size_type __n;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar36;
  undefined1 auVar35 [16];
  Data2D<double> vals;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> global_to_pnts;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> levels;
  vector<double,_std::allocator<double>_> norm;
  SplitDirections split;
  Data2D<int> dagUp;
  allocator_type local_201;
  double *local_200;
  uint local_1f4;
  uint local_1f0;
  int local_1ec;
  double *local_1e8;
  long local_1e0;
  ulong local_1d8;
  pointer local_1d0;
  pointer local_1c8;
  double *local_1c0;
  long local_1b8;
  size_t local_1b0;
  ulong local_1a8;
  uint local_19c;
  vector<bool,_std::allocator<bool>_> local_198;
  long local_170;
  long local_168;
  vector<double,_std::allocator<double>_> local_160;
  vector<int,_std::allocator<int>_> local_148;
  long local_130;
  long local_128;
  vector<int,_std::allocator<int>_> local_120;
  vector<int,_std::allocator<int>_> local_108;
  vector<int,_std::allocator<int>_> local_e8;
  vector<double,_std::allocator<double>_> local_d0;
  SplitDirections local_b8;
  Data2D<int> *local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  double local_60;
  Data2D<int> local_58;
  
  iVar10 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  __n = (size_type)iVar10;
  sVar15 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  local_58.stride = CONCAT44(local_58.stride._4_4_,-(uint)(tolerance == 0.0)) & 0xffffffff00000001;
  local_1e8 = scale_correction;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_b8.job_directions,sVar15 * __n,(value_type_conflict3 *)&local_58,
             (allocator_type *)&local_198);
  piVar29 = local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  __return_storage_ptr__->stride = sVar15;
  __return_storage_ptr__->num_strips = __n;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if ((tolerance != 0.0) || (NAN(tolerance))) {
    local_1b0 = sVar15;
    local_88 = __return_storage_ptr__;
    getNormalization(&local_d0,this);
    local_1f0 = 1;
    if (output == -1) {
      local_1f0 = (this->super_BaseCanonicalGrid).num_outputs;
    }
    local_1e0 = (long)(int)local_1f0;
    local_1c8 = (pointer)0x0;
    local_1c0 = (double *)0x0;
    if (local_1e8 == (double *)0x0) {
      local_58.stride = 0x3ff0000000000000;
      ::std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_b8,local_1e0 * __n,
                 (value_type_conflict2 *)&local_58,(allocator_type *)&local_198);
      local_1c8 = local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      local_1c0 = (double *)
                  local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_1e8 = (double *)
                  local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    auVar8 = _DAT_001ca0b0;
    auVar7 = _DAT_001ca070;
    auVar6 = _DAT_001ca060;
    if (criteria < refine_direction_selective) {
      sVar15 = local_1b0;
      if (0 < iVar10) {
        sVar4 = (this->surpluses).stride;
        pdVar5 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar29 = (pointer)((long)piVar29 + 0xc);
        sVar19 = 0;
        do {
          lVar20 = sVar4 * sVar19;
          if (output == -1) {
            lVar24 = (long)(this->super_BaseCanonicalGrid).num_outputs;
            if (0 < lVar24) {
              bVar16 = true;
              lVar30 = 0;
              do {
                while (bVar16) {
                  dVar32 = (ABS(pdVar5[lVar20 + lVar30]) * (local_1e8 + sVar19 * local_1e0)[lVar30])
                           / local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar30];
                  bVar16 = dVar32 <= tolerance;
                  lVar30 = lVar30 + 1;
                  if (lVar30 == lVar24) goto LAB_001a355d;
                }
                lVar30 = lVar30 + 1;
                bVar16 = false;
              } while (lVar30 != lVar24);
              goto LAB_001a35c0;
            }
          }
          else {
            dVar32 = (ABS(pdVar5[lVar20 + output]) * local_1e8[sVar19 * local_1e0]) /
                     local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[output];
LAB_001a355d:
            if (tolerance < dVar32) {
LAB_001a35c0:
              lVar20 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
              if (0 < lVar20) {
                uVar21 = lVar20 + 0x3fffffffffffffff;
                uVar22 = uVar21 & 0x3fffffffffffffff;
                auVar33._8_4_ = (int)uVar22;
                auVar33._0_8_ = uVar22;
                auVar33._12_4_ = (int)(uVar22 >> 0x20);
                auVar33 = auVar33 ^ auVar6;
                lVar20 = 0;
                do {
                  auVar34._8_4_ = (int)lVar20;
                  auVar34._0_8_ = lVar20;
                  auVar34._12_4_ = (int)((ulong)lVar20 >> 0x20);
                  auVar35 = (auVar34 | auVar7) ^ auVar6;
                  iVar10 = auVar33._4_4_;
                  if ((bool)(~(iVar10 < auVar35._4_4_ ||
                              auVar33._0_4_ < auVar35._0_4_ && auVar35._4_4_ == iVar10) & 1)) {
                    piVar29[lVar20 + -3] = 1;
                  }
                  if (auVar35._12_4_ <= auVar33._12_4_ &&
                      (auVar35._8_4_ <= auVar33._8_4_ || auVar35._12_4_ != auVar33._12_4_)) {
                    piVar29[lVar20 + -2] = 1;
                  }
                  auVar34 = (auVar34 | auVar8) ^ auVar6;
                  iVar36 = auVar34._4_4_;
                  if (iVar36 <= iVar10 && (iVar36 != iVar10 || auVar34._0_4_ <= auVar33._0_4_)) {
                    piVar29[lVar20 + -1] = 1;
                    piVar29[lVar20] = 1;
                  }
                  lVar20 = lVar20 + 4;
                } while ((uVar22 - ((uint)uVar21 & 3)) + 4 != lVar20);
              }
            }
          }
          sVar19 = sVar19 + 1;
          piVar29 = piVar29 + local_1b0;
          sVar15 = local_1b0 * 4;
        } while (sVar19 != __n);
      }
    }
    else {
      mset = &(this->super_BaseCanonicalGrid).points;
      HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)2>(&local_58,mset);
      HierarchyManipulations::SplitDirections::SplitDirections(&local_b8,mset);
      iVar10 = HierarchyManipulations::SplitDirections::getMaxNumPoints(&local_b8);
      ::std::vector<int,_std::allocator<int>_>::vector(&local_120,__n,(allocator_type *)&local_198);
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_e8,(long)iVar10,(allocator_type *)&local_198);
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (ulong *)0x0;
      local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      ::std::vector<int,_std::allocator<int>_>::resize(&local_108,(long)this->top_level + 1);
      ::std::vector<int,_std::allocator<int>_>::resize(&local_148,(long)this->top_level + 1);
      std::vector<bool,_std::allocator<bool>_>::resize(&local_198,(long)iVar10,false);
      if (0 < (int)((ulong)((long)local_b8.job_pnts.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_b8.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        local_130 = (long)output;
        local_68 = (ulong)local_1f0;
        lVar20 = 0;
        local_200 = (double *)piVar29;
        do {
          iVar10 = *(int *)((long)local_b8.job_directions.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar20 * 4);
          lVar24 = (long)iVar10;
          local_1d0 = local_b8.job_pnts.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar20].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
          local_1d8 = (ulong)((long)local_b8.job_pnts.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)local_1d0) >> 2;
          local_170 = local_1e0;
          local_168 = (long)(int)local_1d8;
          ::std::vector<double,_std::allocator<double>_>::vector
                    (&local_160,local_168 * local_1e0,&local_201);
          uVar13 = (uint)local_1d8;
          if (output == -1) {
            if (0 < (int)uVar13) {
              uVar21 = 0;
              uVar17 = 0;
              local_1b8 = lVar20;
              do {
                piVar29 = local_1d0;
                lVar20 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                if (0 < lVar20) {
                  memmove(local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + local_170 * uVar21,
                          (this->super_BaseCanonicalGrid).values.values.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start +
                          (long)local_1d0[uVar21] *
                          (this->super_BaseCanonicalGrid).values.num_outputs,lVar20 << 3);
                }
                local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[piVar29[uVar21]] = (int)uVar21;
                uVar12 = (this->super_BaseCanonicalGrid).points.indexes.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [(long)piVar29[uVar21] *
                          (this->super_BaseCanonicalGrid).points.num_dimensions + lVar24];
                uVar28 = uVar12;
                if ((1 < uVar12) && (uVar28 = 1, uVar12 != 2)) {
                  uVar12 = uVar12 - 1;
                  do {
                    uVar12 = (int)uVar12 >> 1;
                    uVar28 = uVar28 + 1;
                  } while (1 < uVar12);
                }
                local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar21] = uVar28;
                if ((int)uVar17 <= (int)uVar28) {
                  uVar17 = uVar28;
                }
                uVar21 = uVar21 + 1;
              } while (uVar21 != (uVar13 & 0x7fffffff));
              goto LAB_001a3a2f;
            }
          }
          else if (0 < (int)uVar13) {
            sVar15 = (this->super_BaseCanonicalGrid).points.num_dimensions;
            pdVar5 = (this->super_BaseCanonicalGrid).values.values.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar4 = (this->super_BaseCanonicalGrid).values.num_outputs;
            piVar29 = (this->super_BaseCanonicalGrid).points.indexes.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            uVar21 = 0;
            uVar17 = 0;
            do {
              iVar36 = local_1d0[uVar21];
              local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_170 * uVar21] =
                   pdVar5[local_130 + sVar4 * (long)iVar36];
              local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar36] = (int)uVar21;
              uVar12 = piVar29[lVar24 + (long)local_1d0[uVar21] * sVar15];
              uVar28 = uVar12;
              if ((1 < uVar12) && (uVar28 = 1, uVar12 != 2)) {
                uVar12 = uVar12 - 1;
                do {
                  uVar12 = (int)uVar12 >> 1;
                  uVar28 = uVar28 + 1;
                } while (1 < uVar12);
              }
              local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar21] = uVar28;
              if ((int)uVar17 <= (int)uVar28) {
                uVar17 = uVar28;
              }
              uVar21 = uVar21 + 1;
              local_1b8 = lVar20;
            } while (uVar21 != (uVar13 & 0x7fffffff));
LAB_001a3a2f:
            uVar13 = (uint)local_1d8;
            if (0 < (int)uVar17) {
              local_1ec = iVar10 * 2;
              uVar12 = uVar13 & 0x7fffffff;
              local_80 = (ulong)(uVar12 >> 6);
              local_1f4 = uVar13 & 0x3f;
              local_78 = (ulong)((uVar12 >> 6) << 3);
              local_70 = ~(0xffffffffffffffffU >> (-(char)local_1f4 & 0x3fU));
              iVar10 = iVar10 * 2 + 2;
              local_1a8 = 1;
              local_19c = uVar17;
              do {
                if (0 < (int)local_1d8) {
                  local_128 = 0;
                  uVar21 = 0;
                  do {
                    piVar29 = local_1d0;
                    if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar21] == (int)local_1a8) {
                      local_60 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)2>
                                           ((this->super_BaseCanonicalGrid).points.indexes.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start
                                            [(long)local_1d0[uVar21] *
                                             (this->super_BaseCanonicalGrid).points.num_dimensions +
                                             lVar24]);
                      pdVar5 = local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start;
                      lVar20 = local_170;
                      p_Var9 = local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                      *local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start = local_1ec;
                      *local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start = piVar29[uVar21];
                      if (uVar12 < 0x40) {
                        puVar25 = local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                        if (local_1f4 != 0) {
LAB_001a3b74:
                          *puVar25 = *puVar25 & local_70;
                        }
                      }
                      else {
                        memset(local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                               local_78);
                        if (local_1f4 != 0) {
                          puVar25 = p_Var9 + local_80;
                          goto LAB_001a3b74;
                        }
                      }
                      if (*local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start < iVar10) {
                        lVar20 = lVar20 * local_128;
                        iVar36 = 0;
                        piVar11 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        do {
                          iVar1 = piVar11[iVar36];
                          if (iVar1 < iVar10) {
                            iVar2 = local_58.vec.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start
                                    [(long)local_148.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[iVar36] *
                                     local_58.stride + (long)iVar1];
                            lVar30 = (long)iVar2;
                            if (lVar30 != -1) {
                              iVar3 = local_120.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[lVar30];
                              uVar22 = (ulong)iVar3;
                              iVar18 = iVar3 + 0x3f;
                              if (-1 < (long)uVar22) {
                                iVar18 = iVar3;
                              }
                              if ((local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                   [(long)(iVar18 >> 6) +
                                    ((ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) - 1
                                    )] >> (uVar22 & 0x3f) & 1) == 0) {
                                dVar32 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)2>
                                                   (this->order,
                                                    (this->super_BaseCanonicalGrid).points.indexes.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start
                                                    [(this->super_BaseCanonicalGrid).points.
                                                     num_dimensions * lVar30 + lVar24],local_60);
                                iVar1 = local_120.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[lVar30];
                                uVar22 = (ulong)iVar1;
                                if (0 < (int)local_1f0) {
                                  uVar14 = 0;
                                  do {
                                    *(double *)((long)pdVar5 + uVar14 * 8 + lVar20) =
                                         local_160.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start
                                         [local_170 * uVar22 + uVar14] * -dVar32 +
                                         *(double *)((long)pdVar5 + uVar14 * 8 + lVar20);
                                    uVar14 = uVar14 + 1;
                                  } while (local_68 != uVar14);
                                }
                                uVar14 = uVar22 + 0x3f;
                                if (-1 < (long)uVar22) {
                                  uVar14 = uVar22;
                                }
                                local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                [((long)uVar14 >> 6) +
                                 ((ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) - 1)]
                                     = local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p[((long)uVar14 >> 6) +
                                            ((ulong)((uVar22 & 0x800000000000003f) <
                                                    0x8000000000000001) - 1)] |
                                       1L << ((byte)iVar1 & 0x3f);
                                local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[(long)iVar36 + 1] = local_1ec;
                                local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[(long)iVar36 + 1] = iVar2;
                                piVar11 = local_108.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start;
                                iVar36 = iVar36 + 1;
                                goto LAB_001a3c38;
                              }
                            }
                            piVar11[iVar36] = iVar1 + 1;
                          }
                          else {
                            piVar11[(long)iVar36 + -1] = piVar11[(long)iVar36 + -1] + 1;
                            iVar36 = iVar36 + -1;
                          }
LAB_001a3c38:
                        } while (*piVar11 < iVar10);
                      }
                    }
                    uVar21 = uVar21 + 1;
                    local_128 = local_128 + 8;
                  } while (uVar21 != uVar12);
                }
                uVar17 = (uint)local_1a8;
                local_1a8 = (ulong)(uVar17 + 1);
                uVar13 = (uint)local_1d8;
              } while (uVar17 != local_19c);
            }
            lVar20 = local_1b8;
            if (0 < (int)uVar13) {
              sVar15 = (this->surpluses).stride;
              pdVar5 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar21 = 0;
              pdVar23 = local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                lVar30 = (long)local_1d0[uVar21];
                lVar31 = sVar15 * lVar30;
                if (output == -1) {
                  lVar26 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                  bVar16 = true;
                  if (0 < lVar26) {
                    lVar27 = 0;
                    do {
                      if (bVar16 == false) {
                        bVar16 = false;
                      }
                      else {
                        dVar32 = (local_1e8 + lVar30 * local_1e0)[lVar27];
                        bVar16 = true;
                        if (tolerance <
                            (ABS(pdVar5[lVar31 + lVar27]) * dVar32) /
                            local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar27]) {
                          bVar16 = (dVar32 * ABS(pdVar23[lVar27])) /
                                   local_d0.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar27] <= tolerance;
                        }
                      }
                      lVar27 = lVar27 + 1;
                    } while (lVar26 != lVar27);
                  }
                }
                else {
                  dVar32 = local_1e8[lVar30 * local_1e0];
                  bVar16 = true;
                  if (tolerance <
                      (ABS(pdVar5[lVar31 + local_130]) * dVar32) /
                      local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[local_130]) {
                    bVar16 = (dVar32 * ABS(local_160.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start
                                           [local_170 * uVar21])) /
                             local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[local_130] <= tolerance;
                  }
                }
                *(uint *)((long)local_200 + lVar30 * local_1b0 * 4 + lVar24 * 4) =
                     (uint)(bVar16 ^ 1);
                uVar21 = uVar21 + 1;
                pdVar23 = pdVar23 + local_170;
              } while (uVar21 != (uVar13 & 0x7fffffff));
            }
          }
          if (local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_160.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_160.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < (int)((ulong)((long)local_b8.job_pnts.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_b8.job_pnts.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
      }
      if (local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
        operator_delete(local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (ulong *)0x0;
      }
      if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      HierarchyManipulations::SplitDirections::~SplitDirections(&local_b8);
      sVar15 = local_1b0;
      if (local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        sVar15 = local_1b0;
      }
    }
    local_1b0 = sVar15;
    if (local_1c0 != (double *)0x0) {
      operator_delete(local_1c0,(long)local_1c8 - (long)local_1c0);
    }
    __return_storage_ptr__ = local_88;
    if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
      __return_storage_ptr__ = local_88;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> GridLocalPolynomial::buildUpdateMap(double tolerance, TypeRefinement criteria, int output, const double *scale_correction) const{
    int num_points = points.getNumIndexes();
    Data2D<int> pmap(num_dimensions, num_points,
                     std::vector<int>(Utils::size_mult(num_dimensions, num_points),
                                      (tolerance == 0.0) ? 1 : 0) // tolerance 0 means "refine everything"
                    );
    if (tolerance == 0.0) return pmap;

    std::vector<double> norm = getNormalization();

    int active_outputs = (output == -1) ? num_outputs : 1;
    Utils::Wrapper2D<double const> scale(active_outputs, scale_correction);
    std::vector<double> default_scale;
    if (scale_correction == nullptr){
        default_scale = std::vector<double>(Utils::size_mult(active_outputs, num_points), 1.0);
        scale = Utils::Wrapper2D<double const>(active_outputs, default_scale.data());
    }

    if ((criteria == refine_classic) || (criteria == refine_parents_first)){
        #pragma omp parallel for
        for(int i=0; i<num_points; i++){
            bool small = true;
            const double *s = surpluses.getStrip(i);
            const double *c = scale.getStrip(i);
            if (output == -1){
                for(int k=0; k<num_outputs; k++) small = small && ((c[k] * std::abs(s[k]) / norm[k]) <= tolerance);
            }else{
                small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance);
            }
            if (!small)
                std::fill_n(pmap.getStrip(i), num_dimensions, 1);
        }
    }else{
        // construct a series of 1D interpolants and use a refinement criteria that is a combination of the two hierarchical coefficients
        Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points);

        int max_1D_parents = RuleLocal::getMaxNumParents<effrule>();

        HierarchyManipulations::SplitDirections split(points);

        #pragma omp parallel
        {
            int max_nump = split.getMaxNumPoints();
            std::vector<int> global_to_pnts(num_points);
            std::vector<int> levels(max_nump);

            std::vector<int> monkey_count;
            std::vector<int> monkey_tail;
            std::vector<bool> used;
            if (max_1D_parents > 1) {
                monkey_count.resize(top_level + 1);
                monkey_tail.resize(top_level + 1);
                used.resize(max_nump, false);
            }

            #pragma omp for
            for(int j=0; j<split.getNumJobs(); j++){ // split.getNumJobs() gives the number of 1D interpolants to construct
                int d = split.getJobDirection(j);
                int nump = split.getJobNumPoints(j);
                const int *pnts = split.getJobPoints(j);

                int max_level = 0;

                Data2D<double> vals(active_outputs, nump);

                if (output == -1) {
                    for(int i=0; i<nump; i++){
                        std::copy_n(values.getValues(pnts[i]), num_outputs, vals.getStrip(i));
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                } else {
                    for(int i=0; i<nump; i++){
                        vals.getStrip(i)[0] = values.getValues(pnts[i])[output];
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                }

                if (max_1D_parents == 1) {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int branch = dagUp.getStrip(pnts[i])[d];
                                while(branch != -1) {
                                    const int *branch_point = points.getIndex(branch);
                                    double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                    const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                    for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];
                                    branch = dagUp.getStrip(branch)[d];
                                }
                            }
                        }
                    }
                } else {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int current = 0;
                                monkey_count[0] = d * max_1D_parents;
                                monkey_tail[0] = pnts[i]; // uses the global indexes
                                std::fill_n(used.begin(), nump, false);

                                while(monkey_count[0] < (d+1) * max_1D_parents){
                                    if (monkey_count[current] < (d+1) * max_1D_parents){
                                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                                        if ((branch == -1) || (used[global_to_pnts[branch]])){
                                            monkey_count[current]++;
                                        }else{
                                            const int *branch_point = points.getIndex(branch);
                                            double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                            const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                            for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];

                                            used[global_to_pnts[branch]] = true;
                                            monkey_count[++current] = d * max_1D_parents;
                                            monkey_tail[current] = branch;
                                        }
                                    }else{
                                        monkey_count[--current]++;
                                    }
                                }
                            }
                        }
                    }
                }

                // at this point, vals contains the one directional surpluses
                for(int i=0; i<nump; i++){
                    const double *s = surpluses.getStrip(pnts[i]);
                    const double *c = scale.getStrip(pnts[i]);
                    const double *v = vals.getStrip(i);
                    bool small = true;
                    if (output == -1){
                        for(int k=0; k<num_outputs; k++){
                            small = small && (((c[k] * std::abs(s[k]) / norm[k]) <= tolerance) || ((c[k] * std::abs(v[k]) / norm[k]) <= tolerance));
                        }
                    }else{
                        small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance) || ((c[0] * std::abs(v[0]) / norm[output]) <= tolerance);
                    }
                    pmap.getStrip(pnts[i])[d] = (small) ? 0 : 1;;
                }
            }
        }
    }
    return pmap;
}